

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.hpp
# Opt level: O3

void __thiscall
duckdb_jaro_winkler::CachedJaroWinklerSimilarity<char>::
CachedJaroWinklerSimilarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (CachedJaroWinklerSimilarity<char> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first1,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 last1,double prefix_weight_)

{
  invalid_argument *this_00;
  
  (this->s1)._M_dataplus._M_p = (pointer)&(this->s1).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ();
  common::BlockPatternMatchVector::
  BlockPatternMatchVector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&this->PM,first1,last1);
  this->prefix_weight = prefix_weight_;
  if ((0.0 <= prefix_weight_) && (prefix_weight_ <= 0.25)) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"prefix_weight has to be between 0.0 and 0.25");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

CachedJaroWinklerSimilarity(InputIt1 first1, InputIt1 last1, double prefix_weight_ = 0.1)
        : s1(first1, last1), PM(first1, last1), prefix_weight(prefix_weight_)
    {
        if (prefix_weight < 0.0 || prefix_weight > 0.25) {
            throw std::invalid_argument("prefix_weight has to be between 0.0 and 0.25");
        }
    }